

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int tremove(lua_State *L)

{
  StkId pTVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  uint n;
  uint n_00;
  int n_01;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  n_00 = (uint)sVar2;
  uVar3 = luaL_optinteger(L,2,(long)(int)n_00);
  n_01 = (int)uVar3;
  iVar4 = 0;
  if (n_01 <= (int)n_00 && 0 < n_01) {
    iVar4 = 1;
    lua_rawgeti(L,1,n_01);
    if (n_01 < (int)n_00) {
      do {
        n = (int)uVar3 + 1;
        lua_rawgeti(L,1,n);
        lua_rawseti(L,1,(int)uVar3);
        uVar3 = (ulong)n;
      } while (n_00 != n);
    }
    pTVar1 = L->top;
    pTVar1->tt = 0;
    L->top = pTVar1 + 1;
    lua_rawseti(L,1,n_00);
  }
  return iVar4;
}

Assistant:

static int tremove(lua_State*L){
int e=aux_getn(L,1);
int pos=luaL_optint(L,2,e);
if(!(1<=pos&&pos<=e))
return 0;
luaL_setn(L,1,e-1);
lua_rawgeti(L,1,pos);
for(;pos<e;pos++){
lua_rawgeti(L,1,pos+1);
lua_rawseti(L,1,pos);
}
lua_pushnil(L);
lua_rawseti(L,1,e);
return 1;
}